

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void FindFirstSets(lemon *lemp)

{
  rule **pprVar1;
  Boolean BVar2;
  symbol **ppsVar3;
  symbol *psVar4;
  symbol *psVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  rule *prVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  rule *prVar15;
  
  iVar13 = lemp->nsymbol;
  if (0 < (long)iVar13) {
    ppsVar3 = lemp->symbols;
    lVar12 = 0;
    do {
      ppsVar3[lVar12]->lambda = LEMON_FALSE;
      lVar12 = lVar12 + 1;
    } while (iVar13 != lVar12);
  }
  lVar12 = (long)lemp->nterminal;
  if (lemp->nterminal < iVar13) {
    do {
      pcVar9 = SetNew();
      lemp->symbols[lVar12]->firstset = pcVar9;
      lVar12 = lVar12 + 1;
    } while (lVar12 < lemp->nsymbol);
  }
  prVar15 = lemp->rule;
  if (prVar15 != (rule *)0x0) {
    bVar7 = false;
    prVar10 = prVar15;
    do {
      if (prVar10->lhs->lambda == LEMON_FALSE) {
        iVar13 = prVar10->nrhs;
        if ((long)iVar13 < 1) {
          lVar12 = 0;
LAB_00103f21:
          if ((int)lVar12 != iVar13) goto LAB_00103f32;
        }
        else {
          lVar12 = 0;
          do {
            BVar2 = prVar10->rhs[lVar12]->lambda;
            if (prVar10->rhs[lVar12]->type != NONTERMINAL) {
              if (BVar2 != LEMON_FALSE) {
                __assert_fail("sp->type==NONTERMINAL || sp->lambda==LEMON_FALSE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                              ,0x2ce,"void FindFirstSets(struct lemon *)");
              }
              goto LAB_00103f21;
            }
            if (BVar2 == LEMON_FALSE) goto LAB_00103f21;
            lVar12 = lVar12 + 1;
          } while (iVar13 != lVar12);
        }
        prVar10->lhs->lambda = LEMON_TRUE;
        bVar7 = true;
      }
LAB_00103f32:
      pprVar1 = &prVar10->next;
      prVar10 = *pprVar1;
    } while ((*pprVar1 != (rule *)0x0) ||
            ((bVar7 && (bVar7 = false, prVar10 = prVar15, prVar15 != (rule *)0x0))));
  }
  do {
    prVar15 = lemp->rule;
    if (prVar15 == (rule *)0x0) {
      return;
    }
    iVar13 = 0;
    do {
      iVar8 = prVar15->nrhs;
      if (0 < iVar8) {
        psVar4 = prVar15->lhs;
        lVar12 = 0;
        do {
          psVar5 = prVar15->rhs[lVar12];
          if (psVar5->type == TERMINAL) {
            iVar8 = SetAdd(psVar4->firstset,psVar5->index);
            iVar13 = iVar13 + iVar8;
            break;
          }
          if (psVar5->type == MULTITERMINAL) {
            if (0 < psVar5->nsubsym) {
              lVar12 = 0;
              do {
                iVar8 = SetAdd(psVar4->firstset,psVar5->subsym[lVar12]->index);
                iVar13 = iVar13 + iVar8;
                lVar12 = lVar12 + 1;
              } while (lVar12 < psVar5->nsubsym);
            }
            break;
          }
          if (psVar4 == psVar5) {
            if (psVar4->lambda == LEMON_FALSE) break;
          }
          else {
            lVar11 = (long)size;
            if (lVar11 < 1) {
              iVar8 = 0;
            }
            else {
              pcVar9 = psVar4->firstset;
              pcVar6 = psVar5->firstset;
              lVar14 = 0;
              iVar8 = 0;
              do {
                if ((pcVar6[lVar14] != '\0') && (pcVar9[lVar14] == '\0')) {
                  pcVar9[lVar14] = '\x01';
                  iVar8 = 1;
                }
                lVar14 = lVar14 + 1;
              } while (lVar11 != lVar14);
            }
            iVar13 = iVar13 + iVar8;
            if (psVar5->lambda == LEMON_FALSE) break;
            iVar8 = prVar15->nrhs;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar8);
      }
      prVar15 = prVar15->next;
    } while (prVar15 != (rule *)0x0);
    if (iVar13 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void FindFirstSets(struct lemon *lemp)
{
  int i, j;
  struct rule *rp;
  int progress;

  for(i=0; i<lemp->nsymbol; i++){
    lemp->symbols[i]->lambda = LEMON_FALSE;
  }
  for(i=lemp->nterminal; i<lemp->nsymbol; i++){
    lemp->symbols[i]->firstset = SetNew();
  }

  /* First compute all lambdas */
  do{
    progress = 0;
    for(rp=lemp->rule; rp; rp=rp->next){
      if( rp->lhs->lambda ) continue;
      for(i=0; i<rp->nrhs; i++){
         struct symbol *sp = rp->rhs[i];
         assert( sp->type==NONTERMINAL || sp->lambda==LEMON_FALSE );
         if( sp->lambda==LEMON_FALSE ) break;
      }
      if( i==rp->nrhs ){
        rp->lhs->lambda = LEMON_TRUE;
        progress = 1;
      }
    }
  }while( progress );

  /* Now compute all first sets */
  do{
    struct symbol *s1, *s2;
    progress = 0;
    for(rp=lemp->rule; rp; rp=rp->next){
      s1 = rp->lhs;
      for(i=0; i<rp->nrhs; i++){
        s2 = rp->rhs[i];
        if( s2->type==TERMINAL ){
          progress += SetAdd(s1->firstset,s2->index);
          break;
        }else if( s2->type==MULTITERMINAL ){
          for(j=0; j<s2->nsubsym; j++){
            progress += SetAdd(s1->firstset,s2->subsym[j]->index);
          }
          break;
	}else if( s1==s2 ){
          if( s1->lambda==LEMON_FALSE ) break;
	}else{
          progress += SetUnion(s1->firstset,s2->firstset);
          if( s2->lambda==LEMON_FALSE ) break;
	}
      }
    }
  }while( progress );
  return;
}